

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

uchar * jpgd::decompress_jpeg_image_from_stream
                  (jpeg_decoder_stream *pStream,int *width,int *height,int *actual_comps,
                  int req_comps)

{
  uchar uVar1;
  jpgd_status jVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  jpeg_decoder *pjVar7;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  int in_R8D;
  int x_3;
  int b;
  int g;
  int r;
  int x_2;
  int YB;
  int YG;
  int YR;
  uint8 luma_1;
  int x_1;
  uint8 luma;
  int x;
  uint8 *pDst;
  uint scan_line_len;
  uint8 *pScan_line;
  int y;
  uint8 *pImage_data;
  int dst_bpl;
  int image_height;
  int image_width;
  jpeg_decoder decoder;
  jpeg_decoder *in_stack_ffffffffffffc9b8;
  undefined4 in_stack_ffffffffffffc9c0;
  undefined4 in_stack_ffffffffffffc9c4;
  int in_stack_ffffffffffffc9c8;
  int in_stack_ffffffffffffc9cc;
  int in_stack_ffffffffffffc9d0;
  int in_stack_ffffffffffffc9d4;
  jpeg_decoder *this;
  int local_3600;
  int local_35f0;
  int local_35dc;
  int local_35d4;
  uchar *local_35d0;
  void *local_35c0;
  int local_35b4;
  jpeg_decoder local_3588;
  int local_2c;
  int *local_28;
  int *local_20;
  int *local_18;
  jpeg_decoder *local_8;
  
  if (in_RCX == (int *)0x0) {
    local_8 = (jpeg_decoder *)0x0;
  }
  else {
    *in_RCX = 0;
    if ((((in_RDI == 0) || (in_RSI == (int *)0x0)) || (in_RDX == (int *)0x0)) || (in_R8D == 0)) {
      local_8 = (jpeg_decoder *)0x0;
    }
    else if (((in_R8D == 1) || (in_R8D == 3)) || (in_R8D == 4)) {
      local_2c = in_R8D;
      local_28 = in_RCX;
      local_20 = in_RDX;
      local_18 = in_RSI;
      jpeg_decoder::jpeg_decoder
                ((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffc9c4,in_stack_ffffffffffffc9c0),
                 (jpeg_decoder_stream *)in_stack_ffffffffffffc9b8);
      jVar2 = jpeg_decoder::get_error_code(&local_3588);
      if (jVar2 == JPGD_SUCCESS) {
        iVar3 = jpeg_decoder::get_width(&local_3588);
        iVar4 = jpeg_decoder::get_height(&local_3588);
        *local_18 = iVar3;
        *local_20 = iVar4;
        iVar5 = jpeg_decoder::get_num_components(&local_3588);
        *local_28 = iVar5;
        iVar5 = jpeg_decoder::begin_decoding(in_stack_ffffffffffffc9b8);
        if (iVar5 == 0) {
          iVar5 = iVar3 * local_2c;
          pjVar7 = (jpeg_decoder *)jpgd_malloc(0x137971);
          if (pjVar7 == (jpeg_decoder *)0x0) {
            local_8 = (jpeg_decoder *)0x0;
          }
          else {
            this = pjVar7;
            for (local_35b4 = 0; local_8 = pjVar7, local_35b4 < iVar4; local_35b4 = local_35b4 + 1)
            {
              in_stack_ffffffffffffc9d4 =
                   jpeg_decoder::decode
                             (this,(void **)CONCAT44(in_stack_ffffffffffffc9d4,
                                                     in_stack_ffffffffffffc9d0),
                              (uint *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8))
              ;
              if (in_stack_ffffffffffffc9d4 != 0) {
                jpgd_free((void *)0x137a04);
                local_8 = (jpeg_decoder *)0x0;
                break;
              }
              local_35d0 = (uchar *)((long)pjVar7->m_jmp_state[0].__jmpbuf +
                                    (long)(local_35b4 * iVar5));
              if (((local_2c == 1) &&
                  (in_stack_ffffffffffffc9d0 = jpeg_decoder::get_num_components(&local_3588),
                  in_stack_ffffffffffffc9d0 == 1)) ||
                 ((local_2c == 4 &&
                  (in_stack_ffffffffffffc9cc = jpeg_decoder::get_num_components(&local_3588),
                  in_stack_ffffffffffffc9cc == 3)))) {
                memcpy(local_35d0,local_35c0,(long)iVar5);
              }
              else {
                in_stack_ffffffffffffc9c8 = jpeg_decoder::get_num_components(&local_3588);
                if (in_stack_ffffffffffffc9c8 == 1) {
                  if (local_2c == 3) {
                    for (local_35d4 = 0; local_35d4 < iVar3; local_35d4 = local_35d4 + 1) {
                      uVar1 = *(uchar *)((long)local_35c0 + (long)local_35d4);
                      *local_35d0 = uVar1;
                      local_35d0[1] = uVar1;
                      local_35d0[2] = uVar1;
                      local_35d0 = local_35d0 + 3;
                    }
                  }
                  else {
                    for (local_35dc = 0; local_35dc < iVar3; local_35dc = local_35dc + 1) {
                      uVar1 = *(uchar *)((long)local_35c0 + (long)local_35dc);
                      *local_35d0 = uVar1;
                      local_35d0[1] = uVar1;
                      local_35d0[2] = uVar1;
                      local_35d0[3] = 0xff;
                      local_35d0 = local_35d0 + 4;
                    }
                  }
                }
                else {
                  iVar6 = jpeg_decoder::get_num_components(&local_3588);
                  if (iVar6 == 3) {
                    if (local_2c == 1) {
                      for (local_35f0 = 0; local_35f0 < iVar3; local_35f0 = local_35f0 + 1) {
                        *local_35d0 = (uchar)((uint)*(byte *)((long)local_35c0 +
                                                             (long)(local_35f0 << 2)) * 0x4c8b +
                                              (uint)*(byte *)((long)local_35c0 +
                                                             (long)(local_35f0 * 4 + 1)) * 0x9646 +
                                              (uint)*(byte *)((long)local_35c0 +
                                                             (long)(local_35f0 * 4 + 2)) * 0x1d2f +
                                              0x8000 >> 0x10);
                        local_35d0 = local_35d0 + 1;
                      }
                    }
                    else {
                      for (local_3600 = 0; local_3600 < iVar3; local_3600 = local_3600 + 1) {
                        *local_35d0 = *(uchar *)((long)local_35c0 + (long)(local_3600 << 2));
                        local_35d0[1] = *(uchar *)((long)local_35c0 + (long)(local_3600 * 4 + 1));
                        local_35d0[2] = *(uchar *)((long)local_35c0 + (long)(local_3600 * 4 + 2));
                        local_35d0 = local_35d0 + 3;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          local_8 = (jpeg_decoder *)0x0;
        }
      }
      else {
        local_8 = (jpeg_decoder *)0x0;
      }
      jpeg_decoder::~jpeg_decoder((jpeg_decoder *)0x137d97);
    }
    else {
      local_8 = (jpeg_decoder *)0x0;
    }
  }
  return (uchar *)local_8;
}

Assistant:

unsigned char* decompress_jpeg_image_from_stream(jpeg_decoder_stream* pStream, int* width, int* height, int* actual_comps, int req_comps) {
  if (!actual_comps)
    return NULL;
  *actual_comps = 0;

  if ((!pStream) || (!width) || (!height) || (!req_comps))
    return NULL;

  if ((req_comps != 1) && (req_comps != 3) && (req_comps != 4))
    return NULL;

  jpeg_decoder decoder(pStream);
  if (decoder.get_error_code() != JPGD_SUCCESS)
    return NULL;

  const int image_width = decoder.get_width(), image_height = decoder.get_height();
  *width = image_width;
  *height = image_height;
  *actual_comps = decoder.get_num_components();

  if (decoder.begin_decoding() != JPGD_SUCCESS)
    return NULL;

  const int dst_bpl = image_width * req_comps;

  uint8* pImage_data = (uint8*)jpgd_malloc(dst_bpl * image_height);
  if (!pImage_data)
    return NULL;

  for (int y = 0; y < image_height; y++) {
    const uint8* pScan_line;
    uint scan_line_len;
    if (decoder.decode((const void**)&pScan_line, &scan_line_len) != JPGD_SUCCESS) {
      jpgd_free(pImage_data);
      return NULL;
    }

    uint8* pDst = pImage_data + y * dst_bpl;

    if (((req_comps == 1) && (decoder.get_num_components() == 1)) || ((req_comps == 4) && (decoder.get_num_components() == 3)))
      memcpy(pDst, pScan_line, dst_bpl);
    else if (decoder.get_num_components() == 1) {
      if (req_comps == 3) {
        for (int x = 0; x < image_width; x++) {
          uint8 luma = pScan_line[x];
          pDst[0] = luma;
          pDst[1] = luma;
          pDst[2] = luma;
          pDst += 3;
        }
      } else {
        for (int x = 0; x < image_width; x++) {
          uint8 luma = pScan_line[x];
          pDst[0] = luma;
          pDst[1] = luma;
          pDst[2] = luma;
          pDst[3] = 255;
          pDst += 4;
        }
      }
    } else if (decoder.get_num_components() == 3) {
      if (req_comps == 1) {
        const int YR = 19595, YG = 38470, YB = 7471;
        for (int x = 0; x < image_width; x++) {
          int r = pScan_line[x * 4 + 0];
          int g = pScan_line[x * 4 + 1];
          int b = pScan_line[x * 4 + 2];
          *pDst++ = static_cast<uint8>((r * YR + g * YG + b * YB + 32768) >> 16);
        }
      } else {
        for (int x = 0; x < image_width; x++) {
          pDst[0] = pScan_line[x * 4 + 0];
          pDst[1] = pScan_line[x * 4 + 1];
          pDst[2] = pScan_line[x * 4 + 2];
          pDst += 3;
        }
      }
    }
  }

  return pImage_data;
}